

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeyboard.cpp
# Opt level: O1

bool __thiscall OIS::LinuxKeyboard::_injectKeyUp(LinuxKeyboard *this,KeyCode kc)

{
  uint *puVar1;
  KeyListener *pKVar2;
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  if ((int)kc < 0x100) {
    uVar6 = (ulong)kc;
  }
  this->KeyBuffer[uVar6] = '\0';
  uVar5 = (uint)uVar6 & 0xffffff7f;
  uVar4 = 0xffffffef;
  if ((((uVar5 == 0x1d) || (uVar4 = 0xfffffffe, kc == KC_LSHIFT)) || (kc == KC_RSHIFT)) ||
     (uVar4 = 0xfffffeff, uVar5 == 0x38)) {
    puVar1 = &(this->super_Keyboard).mModifiers;
    *puVar1 = *puVar1 & uVar4;
  }
  uVar3 = 1;
  if (((this->super_Keyboard).super_Object.mBuffered == true) &&
     (pKVar2 = (this->super_Keyboard).mListener, pKVar2 != (KeyListener *)0x0)) {
    uVar3 = (**(code **)(*(long *)pKVar2 + 0x18))(pKVar2);
  }
  return (bool)uVar3;
}

Assistant:

bool LinuxKeyboard::_injectKeyUp(KeyCode kc)
{
	if(kc > 255) kc = KC_UNASSIGNED;
	KeyBuffer[kc] = 0;

	//Turn off modifier flags
	if(kc == KC_LCONTROL || kc == KC_RCONTROL)
		mModifiers &= ~Ctrl;
	else if(kc == KC_LSHIFT || kc == KC_RSHIFT)
		mModifiers &= ~Shift;
	else if(kc == KC_LMENU || kc == KC_RMENU)
		mModifiers &= ~Alt;

	if(mBuffered && mListener)
		return mListener->keyReleased(KeyEvent(this, kc, 0));

	return true;
}